

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::process_mcu_row(jpeg_encoder *this)

{
  jpeg_encoder *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  if (in_RDI->m_num_components == '\x01') {
    for (local_c = 0; local_c < in_RDI->m_mcus_per_row; local_c = local_c + 1) {
      load_block_8_8_grey(in_RDI,local_c);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  else if ((in_RDI->m_comp_h_samp[0] == '\x01') && (in_RDI->m_comp_v_samp[0] == '\x01')) {
    for (local_10 = 0; local_10 < in_RDI->m_mcus_per_row; local_10 = local_10 + 1) {
      load_block_8_8(in_RDI,local_10,0,0);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_8_8(in_RDI,local_10,0,1);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_8_8(in_RDI,local_10,0,2);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  else if ((in_RDI->m_comp_h_samp[0] == '\x02') && (in_RDI->m_comp_v_samp[0] == '\x01')) {
    for (local_14 = 0; local_14 < in_RDI->m_mcus_per_row; local_14 = local_14 + 1) {
      load_block_8_8(in_RDI,local_14 << 1,0,0);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_8_8(in_RDI,local_14 * 2 + 1,0,0);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_16_8_8(in_RDI,local_14,1);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_16_8_8(in_RDI,local_14,2);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  else if ((in_RDI->m_comp_h_samp[0] == '\x02') && (in_RDI->m_comp_v_samp[0] == '\x02')) {
    for (local_18 = 0; local_18 < in_RDI->m_mcus_per_row; local_18 = local_18 + 1) {
      load_block_8_8(in_RDI,local_18 << 1,0,0);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_8_8(in_RDI,local_18 * 2 + 1,0,0);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_8_8(in_RDI,local_18 << 1,1,0);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_8_8(in_RDI,local_18 * 2 + 1,1,0);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_16_8(in_RDI,local_18,1);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
      load_block_16_8(in_RDI,local_18,2);
      code_block(in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void jpeg_encoder::process_mcu_row() {
  if (m_num_components == 1) {
    for (int i = 0; i < m_mcus_per_row; i++) {
      load_block_8_8_grey(i);
      code_block(0);
    }
  } else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1)) {
    for (int i = 0; i < m_mcus_per_row; i++) {
      load_block_8_8(i, 0, 0);
      code_block(0);
      load_block_8_8(i, 0, 1);
      code_block(1);
      load_block_8_8(i, 0, 2);
      code_block(2);
    }
  } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1)) {
    for (int i = 0; i < m_mcus_per_row; i++) {
      load_block_8_8(i * 2 + 0, 0, 0);
      code_block(0);
      load_block_8_8(i * 2 + 1, 0, 0);
      code_block(0);
      load_block_16_8_8(i, 1);
      code_block(1);
      load_block_16_8_8(i, 2);
      code_block(2);
    }
  } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2)) {
    for (int i = 0; i < m_mcus_per_row; i++) {
      load_block_8_8(i * 2 + 0, 0, 0);
      code_block(0);
      load_block_8_8(i * 2 + 1, 0, 0);
      code_block(0);
      load_block_8_8(i * 2 + 0, 1, 0);
      code_block(0);
      load_block_8_8(i * 2 + 1, 1, 0);
      code_block(0);
      load_block_16_8(i, 1);
      code_block(1);
      load_block_16_8(i, 2);
      code_block(2);
    }
  }
}